

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChExceptionArchive::ChExceptionArchive(ChExceptionArchive *this,string *swhat)

{
  string local_38 [32];
  string *local_18;
  string *swhat_local;
  ChExceptionArchive *this_local;
  
  local_18 = swhat;
  swhat_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)swhat);
  ChException::ChException(&this->super_ChException,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)&this->super_ChException = &PTR__ChExceptionArchive_00145020;
  return;
}

Assistant:

ChExceptionArchive(std::string swhat) : ChException(swhat){}